

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_test_util.cc
# Opt level: O0

int __thiscall
ctemplate::TemplateDictionaryPeer::GetSectionDictionaries
          (TemplateDictionaryPeer *this,TemplateString *section_name,
          vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
          *dicts)

{
  Iterator *this_00;
  ulong uVar1;
  TemplateDictionaryInterface *f;
  size_type sVar2;
  TemplateDictionary *local_38;
  long *local_30;
  Iterator *di;
  vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
  *dicts_local;
  TemplateString *section_name_local;
  TemplateDictionaryPeer *this_local;
  
  di = (Iterator *)dicts;
  dicts_local = (vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
                 *)section_name;
  section_name_local = (TemplateString *)this;
  std::
  vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
  ::clear(dicts);
  uVar1 = (**(code **)(*(long *)this->dict_ + 0x18))(this->dict_,dicts_local);
  if ((uVar1 & 1) == 0) {
    local_30 = (long *)(**(code **)(*(long *)this->dict_ + 0x40))(this->dict_,dicts_local);
    while( true ) {
      uVar1 = (**(code **)(*local_30 + 0x10))();
      this_00 = di;
      if ((uVar1 & 1) == 0) break;
      f = (TemplateDictionaryInterface *)(**(code **)(*local_30 + 0x18))();
      local_38 = down_cast<ctemplate::TemplateDictionary_const*,ctemplate::TemplateDictionaryInterface_const>
                           (f);
      std::
      vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
      ::push_back((vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
                   *)this_00,&local_38);
    }
    if (local_30 != (long *)0x0) {
      (**(code **)(*local_30 + 8))();
    }
    sVar2 = std::
            vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
            ::size((vector<const_ctemplate::TemplateDictionary_*,_std::allocator<const_ctemplate::TemplateDictionary_*>_>
                    *)di);
    this_local._4_4_ = (int)sVar2;
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int TemplateDictionaryPeer::GetSectionDictionaries(
    const TemplateString& section_name,
    vector<const TemplateDictionary*>* dicts) const {
  dicts->clear();
  if (dict_->IsHiddenSection(section_name))
    return 0;

  TemplateDictionaryInterface::Iterator* di =
      dict_->CreateSectionIterator(section_name);
  while (di->HasNext())
    dicts->push_back(down_cast<const TemplateDictionary*>(&di->Next()));
  delete di;

  return static_cast<int>(dicts->size());
}